

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_send_and_recv(connectdata *conn,void **msg)

{
  size_t *psVar1;
  timeval *ptVar2;
  size_t sVar3;
  char *pcVar4;
  unsigned_short uVar5;
  CURLcode CVar6;
  CURLcode CVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  int nread;
  undefined4 uStack_2c;
  
  sVar12 = (conn->proto).ftpc.pp.sendsize;
  CVar7 = CURLE_AGAIN;
  if (sVar12 == 0) {
    uVar8 = (conn->proto).smbc.upload_size;
    if (uVar8 == 0) goto LAB_0059a331;
    uVar9 = 0x4000;
    if (uVar8 < 0x4000) {
      uVar9 = uVar8;
    }
    nread = (int)uVar9;
    (conn->data->req).upload_fromhere = (conn->data->state).uploadbuffer;
    CVar6 = Curl_fillreadbuffer(conn,nread,&nread);
    if ((CVar6 != CURLE_AGAIN) && (CVar6 != CURLE_OK)) {
      return CVar6;
    }
    sVar12 = (size_t)nread;
    if (sVar12 == 0) {
      return CURLE_OK;
    }
    psVar1 = &(conn->proto).ftpc.pp.sendleft;
    *psVar1 = *psVar1 - sVar12;
    (conn->proto).smbc.send_size = sVar12;
    (conn->proto).ftpc.pp.response.tv_sec = 0;
  }
  sVar3 = (conn->proto).smbc.sent;
  sVar12 = sVar12 - sVar3;
  CVar6 = Curl_write(conn,0,(conn->data->state).uploadbuffer + sVar3,sVar12,(ssize_t *)&nread);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  if (CONCAT44(uStack_2c,nread) == sVar12) {
    (conn->proto).ftpc.pp.sendsize = 0;
  }
  else {
    ptVar2 = &(conn->proto).ftpc.pp.response;
    ptVar2->tv_sec = ptVar2->tv_sec + CONCAT44(uStack_2c,nread);
    if ((conn->proto).ftpc.pp.sendsize != 0) {
      return CURLE_AGAIN;
    }
  }
LAB_0059a331:
  if ((conn->proto).ftpc.pp.sendleft == 0) {
    pcVar4 = (conn->proto).ftpc.pp.sendthis;
    sVar12 = (conn->proto).smbc.got;
    CVar7 = Curl_read(conn,0,pcVar4 + sVar12,0x9000 - sVar12,(ssize_t *)&nread);
    if (CVar7 == CURLE_OK) {
      if ((CONCAT44(uStack_2c,nread) != 0) &&
         (uVar8 = CONCAT44(uStack_2c,nread) + (conn->proto).ftpc.pp.response.tv_usec,
         (conn->proto).ftpc.pp.response.tv_usec = uVar8, 3 < uVar8)) {
        uVar5 = Curl_read16_be((uchar *)(pcVar4 + 2));
        if ((ulong)uVar5 + 4 <= (ulong)(conn->proto).ftpc.pp.response.tv_usec) {
          if (0x20 < uVar5) {
            uVar11 = (uint)(byte)pcVar4[0x24] * 2 + 0x27;
            uVar10 = (uint)((ulong)uVar5 + 4);
            if ((uVar11 <= uVar10) &&
               (uVar5 = Curl_read16_le((uchar *)(pcVar4 + (ulong)((uint)(byte)pcVar4[0x24] * 2) +
                                                          0x25)), uVar10 < uVar11 + uVar5)) {
              return CURLE_READ_ERROR;
            }
          }
          *msg = pcVar4;
        }
      }
      CVar7 = CURLE_OK;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode smb_send_and_recv(struct connectdata *conn, void **msg)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    int nread = smbc->upload_size > UPLOAD_BUFSIZE ? UPLOAD_BUFSIZE :
      (int) smbc->upload_size;
    conn->data->req.upload_fromhere = conn->data->state.uploadbuffer;
    result = Curl_fillreadbuffer(conn, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(conn);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(conn, msg);
}